

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::GLMClassifier::_InternalSerialize
          (GLMClassifier *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  void *pvVar2;
  StringVector *this_00;
  Int64Vector *this_01;
  bool bVar3;
  GLMClassifier *pGVar4;
  Type *this_02;
  LogMessage *other;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int index;
  uint size;
  size_t sVar10;
  undefined8 *puVar11;
  byte *pbVar12;
  byte *ptr;
  LogFinisher local_71;
  GLMClassifier *local_70;
  LogMessage local_68;
  
  iVar1 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
  local_70 = this;
  if (iVar1 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                          (&(this->weights_).super_RepeatedPtrFieldBase,index);
      *target = 10;
      uVar7 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (byte)uVar7;
      if (uVar7 < 0x80) {
        pbVar12 = target + 2;
      }
      else {
        pbVar12 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                            (uVar7,target + 1);
      }
      target = GLMClassifier_DoubleArray::_InternalSerialize(this_02,pbVar12,stream);
      index = index + 1;
    } while (iVar1 != index);
  }
  pGVar4 = local_70;
  if (0 < (local_70->offset_).current_size_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar1 = (pGVar4->offset_).current_size_;
    if (stream->end_ <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_71,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    size = iVar1 << 3;
    *target = 0x12;
    pbVar12 = target + 1;
    uVar7 = size;
    uVar6 = size;
    if (0x7f < size) {
      do {
        target = pbVar12;
        *target = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar12 = target + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
    ptr = target + 2;
    *pbVar12 = (byte)uVar7;
    pvVar2 = (local_70->offset_).arena_or_elements_;
    sVar10 = (size_t)(int)size;
    if ((long)stream->end_ - (long)ptr < (long)sVar10) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,pvVar2,size,ptr);
    }
    else {
      memcpy(ptr,pvVar2,sVar10);
      target = ptr + sVar10;
    }
  }
  pGVar4 = local_70;
  if (local_70->postevaluationtransform_ != 0) {
    pbVar12 = target;
    if (stream->end_ <= target) {
      pbVar12 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = pGVar4->postevaluationtransform_;
    *pbVar12 = 0x18;
    pbVar12[1] = (byte)uVar7;
    if ((ulong)(long)(int)uVar7 < 0x80) {
      target = pbVar12 + 2;
    }
    else {
      pbVar12[1] = (byte)uVar7 | 0x80;
      uVar8 = (ulong)(long)(int)uVar7 >> 7;
      pbVar12[2] = (byte)uVar8;
      target = pbVar12 + 3;
      if (0x3fff < uVar7) {
        uVar9 = (ulong)pbVar12[2];
        do {
          target[-1] = (byte)uVar9 | 0x80;
          uVar5 = uVar8 >> 7;
          *target = (byte)uVar5;
          target = target + 1;
          uVar9 = uVar5 & 0xffffffff;
          bVar3 = 0x3fff < uVar8;
          uVar8 = uVar5;
        } while (bVar3);
      }
    }
  }
  pbVar12 = target;
  if (pGVar4->classencoding_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = pGVar4->classencoding_;
    *target = 0x20;
    target[1] = (byte)uVar7;
    if ((ulong)(long)(int)uVar7 < 0x80) {
      pbVar12 = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      uVar8 = (ulong)(long)(int)uVar7 >> 7;
      target[2] = (byte)uVar8;
      pbVar12 = target + 3;
      if (0x3fff < uVar7) {
        uVar9 = (ulong)target[2];
        do {
          pbVar12[-1] = (byte)uVar9 | 0x80;
          uVar5 = uVar8 >> 7;
          *pbVar12 = (byte)uVar5;
          pbVar12 = pbVar12 + 1;
          uVar9 = uVar5 & 0xffffffff;
          bVar3 = 0x3fff < uVar8;
          uVar8 = uVar5;
        } while (bVar3);
      }
    }
  }
  if (pGVar4->_oneof_case_[0] == 100) {
    if (stream->end_ <= pbVar12) {
      pbVar12 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar12);
    }
    this_00 = (pGVar4->ClassLabels_).stringclasslabels_;
    pbVar12[0] = 0xa2;
    pbVar12[1] = 6;
    uVar7 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    pbVar12[2] = (byte)uVar7;
    if (uVar7 < 0x80) {
      pbVar12 = pbVar12 + 3;
    }
    else {
      pbVar12 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar7,pbVar12 + 2);
    }
    pbVar12 = StringVector::_InternalSerialize(this_00,pbVar12,stream);
  }
  if (pGVar4->_oneof_case_[0] == 0x65) {
    if (stream->end_ <= pbVar12) {
      pbVar12 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar12);
    }
    this_01 = (pGVar4->ClassLabels_).int64classlabels_;
    pbVar12[0] = 0xaa;
    pbVar12[1] = 6;
    uVar7 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    pbVar12[2] = (byte)uVar7;
    if (uVar7 < 0x80) {
      pbVar12 = pbVar12 + 3;
    }
    else {
      pbVar12 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar7,pbVar12 + 2);
    }
    pbVar12 = Int64Vector::_InternalSerialize(this_01,pbVar12,stream);
  }
  uVar8 = (pGVar4->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    pvVar2 = *(void **)((uVar8 & 0xfffffffffffffffc) + 8);
    uVar8 = (pGVar4->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar8 & 1) == 0) {
      puVar11 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar11 = (undefined8 *)((uVar8 & 0xfffffffffffffffc) + 8);
    }
    sVar10 = (size_t)(int)puVar11[1];
    if ((long)stream->end_ - (long)pbVar12 < (long)sVar10) {
      pbVar12 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                          (stream,pvVar2,(int)puVar11[1],pbVar12);
    }
    else {
      memcpy(pbVar12,pvVar2,sVar10);
      pbVar12 = pbVar12 + sVar10;
    }
  }
  return pbVar12;
}

Assistant:

uint8_t* GLMClassifier::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.GLMClassifier)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_weights_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_weights(i), target, stream);
  }

  // repeated double offset = 2;
  if (this->_internal_offset_size() > 0) {
    target = stream->WriteFixedPacked(2, _internal_offset(), target);
  }

  // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->_internal_postevaluationtransform() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      3, this->_internal_postevaluationtransform(), target);
  }

  // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
  if (this->_internal_classencoding() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      4, this->_internal_classencoding(), target);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (_internal_has_stringclasslabels()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        100, _Internal::stringclasslabels(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (_internal_has_int64classlabels()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        101, _Internal::int64classlabels(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.GLMClassifier)
  return target;
}